

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttype1.c
# Opt level: O0

FT_Long FT_Get_PS_Font_Value
                  (FT_Face face,PS_Dict_Keys key,FT_UInt idx,void *value,FT_Long value_len)

{
  FT_Driver pFVar1;
  FT_Module_Interface local_48;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Service_PsInfo service;
  FT_Int result;
  FT_Long value_len_local;
  void *value_local;
  FT_UInt idx_local;
  PS_Dict_Keys key_local;
  FT_Face face_local;
  
  service._4_4_ = 0;
  if (face != (FT_Face)0x0) {
    pFVar1 = face->driver;
    local_48 = (FT_Module_Interface)0x0;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_48 = (*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"postscript-info");
    }
    if ((local_48 != (FT_Module_Interface)0x0) && (*(long *)((long)local_48 + 0x20) != 0)) {
      service._4_4_ = (**(code **)((long)local_48 + 0x20))(face,key,idx,value,value_len);
    }
  }
  return (long)service._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Long )
  FT_Get_PS_Font_Value( FT_Face       face,
                        PS_Dict_Keys  key,
                        FT_UInt       idx,
                        void         *value,
                        FT_Long       value_len )
  {
    FT_Int             result  = 0;
    FT_Service_PsInfo  service = NULL;


    if ( face )
    {
      FT_FACE_FIND_SERVICE( face, service, POSTSCRIPT_INFO );

      if ( service && service->ps_get_font_value )
        result = service->ps_get_font_value( face, key, idx,
                                             value, value_len );
    }

    return result;
  }